

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<Header*,long_long>
               (Header *first,longlong n,Header *d_first)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  Header *pHVar4;
  Header *pHVar5;
  Header *pHVar6;
  Header *pHVar7;
  long in_FS_OFFSET;
  Destructor local_68;
  Header *local_48;
  anon_class_8_1_a78179b7_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.iter = &local_48;
  local_68.intermediate = (Header *)&DAT_aaaaaaaaaaaaaaaa;
  pHVar7 = d_first + n;
  pHVar6 = first;
  pHVar4 = pHVar7;
  if (first < pHVar7) {
    pHVar6 = pHVar7;
    pHVar4 = first;
  }
  local_68.end = d_first;
  local_48 = d_first;
  if (d_first != pHVar4) {
    do {
      pHVar5 = local_48;
      *(__index_type *)
       ((long)&(local_48->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = 0xff;
      *(__index_type *)
       ((long)&(local_48->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) =
           *(__index_type *)
            ((long)&(first->name).data.
                    super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18);
      local_40.__lhs = (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)local_48
      ;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
        ::_S_vtable._M_arr
        [(long)(char)*(__index_type *)
                      ((long)&(first->name).data.
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> +
                      0x18) + 1]._M_data)
                (&local_40,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)first);
      pDVar1 = (first->value).d.d;
      (first->value).d.d = (Data *)0x0;
      (pHVar5->value).d.d = pDVar1;
      pcVar2 = (first->value).d.ptr;
      (first->value).d.ptr = (char *)0x0;
      (pHVar5->value).d.ptr = pcVar2;
      qVar3 = (first->value).d.size;
      (first->value).d.size = 0;
      (pHVar5->value).d.size = qVar3;
      local_48 = local_48 + 1;
      first = first + 1;
    } while (local_48 != pHVar4);
  }
  local_68.intermediate = *local_68.iter;
  local_68.iter = &local_68.intermediate;
  if (local_48 != pHVar7) {
    do {
      pHVar4 = local_48;
      local_40.__lhs = (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)local_48
      ;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(long)(char)*(__index_type *)
                      ((long)&(first->name).data.
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> +
                      0x18) + 1]._M_data)
                ((anon_class_8_1_8991fb9c *)&local_40,
                 (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)first);
      pDVar1 = (pHVar4->value).d.d;
      (pHVar4->value).d.d = (first->value).d.d;
      (first->value).d.d = pDVar1;
      pcVar2 = (pHVar4->value).d.ptr;
      (pHVar4->value).d.ptr = (first->value).d.ptr;
      (first->value).d.ptr = pcVar2;
      qVar3 = (pHVar4->value).d.size;
      (pHVar4->value).d.size = (first->value).d.size;
      (first->value).d.size = qVar3;
      local_48 = local_48 + 1;
      first = first + 1;
    } while (local_48 != pHVar7);
  }
  local_68.iter = &local_68.end;
  if (first != pHVar6) {
    q_relocate_overlap_n_left_move<Header*,long_long>();
  }
  q_relocate_overlap_n_left_move<Header_*,_long_long>::Destructor::~Destructor(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}